

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000014d630 = 0x2d2d2d2d2d2d2d;
    uRam000000000014d637 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0014d620 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000014d628 = 0x2d2d2d2d2d2d2d;
    DAT_0014d62f = 0x2d;
    _DAT_0014d610 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000014d618 = 0x2d2d2d2d2d2d2d2d;
    _DAT_0014d600 = 0x2d2d2d2d2d2d2d2d;
    uRam000000000014d608 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam000000000014d5f8 = 0x2d2d2d2d2d2d2d2d;
    DAT_0014d63f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }